

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_plt_tet_zone(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  double dVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  FILE *pFVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  double *pdVar10;
  int iVar11;
  undefined4 in_register_00000034;
  long lVar12;
  char *pcVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double maxdata;
  double mindata;
  REF_GLOB *l2c;
  double tempdata;
  int dataformat;
  int connsharing;
  int varsharing;
  int passive;
  float zonemarker;
  REF_GLOB nnode;
  REF_LONG ncell;
  double local_b0;
  double local_a8;
  REF_GLOB *local_a0;
  ulong local_98;
  double local_90;
  int local_84;
  FILE *local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  ulong local_68;
  double *local_60;
  long local_58;
  long local_50;
  REF_CELL local_48;
  ulong local_40;
  double *local_38;
  
  local_98 = CONCAT44(in_register_00000034,ldim);
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  pRVar2 = ref_grid->cell[8];
  local_6c = 0x43958000;
  local_84 = 2;
  local_70 = 0;
  local_74 = 0;
  local_78 = 0xffffffff;
  local_60 = scalar;
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"plt tet start");
  }
  uVar4 = ref_grid_compact_cell_nodes(ref_grid,pRVar2,&local_58,&local_50,&local_a0);
  if (uVar4 == 0) {
    if ((local_58 < 1) || (local_50 < 1)) {
LAB_00187a26:
      if (local_a0 == (REF_GLOB *)0x0) {
        return 0;
      }
      free(local_a0);
      return 0;
    }
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"plt tet compact");
    }
    if (ref_mpi->id == 0) {
      sVar5 = fwrite(&local_6c,4,1,(FILE *)file);
      if (sVar5 != 1) {
        pcVar13 = "zonemarker";
        uVar8 = 0xff9;
LAB_00187a99:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar8,"ref_gather_plt_tet_zone",pcVar13,1,sVar5);
        return 1;
      }
      if (-3 < (int)local_98) {
        iVar11 = 0;
        if (0 < (int)local_98 + 2) {
          iVar11 = (int)local_98 + 2;
        }
        iVar11 = iVar11 + 1;
        do {
          sVar5 = fwrite(&local_84,4,1,(FILE *)file);
          if (sVar5 != 1) {
            pcVar13 = "int";
            uVar8 = 0xffc;
            goto LAB_00187a99;
          }
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      sVar5 = fwrite(&local_70,4,1,(FILE *)file);
      if (sVar5 != 1) {
        pcVar13 = "int";
        uVar8 = 0xfff;
        goto LAB_00187a99;
      }
      sVar5 = fwrite(&local_74,4,1,(FILE *)file);
      if (sVar5 != 1) {
        pcVar13 = "int";
        uVar8 = 0x1000;
        goto LAB_00187a99;
      }
      sVar5 = fwrite(&local_78,4,1,(FILE *)file);
      if (sVar5 != 1) {
        pcVar13 = "int";
        uVar8 = 0x1001;
        goto LAB_00187a99;
      }
    }
    lVar16 = 0;
    lVar15 = 0;
    local_80 = (FILE *)file;
    local_48 = pRVar2;
    do {
      local_a8 = 1e+200;
      local_b0 = -1e+200;
      local_90 = 1e+200;
      if (0 < (long)ref_node->max) {
        lVar12 = 0;
        local_90 = 1e+200;
        dVar17 = -1e+200;
        lVar9 = lVar16;
        do {
          if ((local_a0[lVar12] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar12])) {
            dVar1 = *(double *)((long)ref_node->real + lVar9);
            if (dVar1 <= local_90) {
              local_90 = dVar1;
            }
            dVar1 = *(double *)((long)ref_node->real + lVar9);
            local_b0 = dVar17;
            local_a8 = local_90;
            if (dVar17 <= dVar1) {
              dVar17 = dVar1;
              local_b0 = dVar1;
            }
          }
          lVar12 = lVar12 + 1;
          lVar9 = lVar9 + 0x78;
        } while (ref_node->max != lVar12);
      }
      uVar4 = ref_mpi_min(ref_mpi,&local_90,&local_a8,3);
      if (uVar4 != 0) {
        pcVar13 = "mpi min";
        uVar8 = 0x100e;
        goto LAB_00187360;
      }
      local_90 = local_b0;
      uVar4 = ref_mpi_max(ref_mpi,&local_90,&local_b0,3);
      pFVar3 = local_80;
      if (uVar4 != 0) {
        pcVar13 = "mpi max";
        uVar8 = 0x1010;
        goto LAB_00187360;
      }
      if (ref_mpi->id == 0) {
        sVar5 = fwrite(&local_a8,8,1,local_80);
        if (sVar5 != 1) {
          pcVar13 = "mindata";
          uVar8 = 0x1012;
          goto LAB_00187a99;
        }
        sVar5 = fwrite(&local_b0,8,1,pFVar3);
        if (sVar5 != 1) {
          pcVar13 = "maxdata";
          uVar8 = 0x1013;
          goto LAB_00187a99;
        }
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 8;
    } while (lVar15 != 3);
    if (0 < (int)local_98) {
      uVar6 = local_98 & 0xffffffff;
      uVar7 = 0;
      pdVar14 = local_60;
      local_40 = uVar6;
      do {
        local_a8 = 1e+200;
        local_b0 = -1e+200;
        local_90 = 1e+200;
        if (0 < (long)ref_node->max) {
          lVar15 = 0;
          local_90 = 1e+200;
          dVar17 = -1e+200;
          pdVar10 = pdVar14;
          do {
            if ((local_a0[lVar15] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar15])) {
              dVar1 = *pdVar10;
              if (dVar1 <= local_90) {
                local_90 = dVar1;
              }
              local_b0 = dVar17;
              local_a8 = local_90;
              if (dVar17 <= dVar1) {
                dVar17 = dVar1;
                local_b0 = dVar1;
              }
            }
            lVar15 = lVar15 + 1;
            pdVar10 = pdVar10 + uVar6;
          } while (ref_node->max != lVar15);
        }
        local_68 = uVar7;
        local_38 = pdVar14;
        uVar4 = ref_mpi_min(ref_mpi,&local_90,&local_a8,3);
        if (uVar4 != 0) {
          pcVar13 = "mpi min";
          uVar8 = 0x1020;
          goto LAB_00187360;
        }
        local_90 = local_b0;
        uVar4 = ref_mpi_max(ref_mpi,&local_90,&local_b0,3);
        pFVar3 = local_80;
        if (uVar4 != 0) {
          pcVar13 = "mpi max";
          uVar8 = 0x1022;
          goto LAB_00187360;
        }
        if (ref_mpi->id == 0) {
          sVar5 = fwrite(&local_a8,8,1,local_80);
          if (sVar5 != 1) {
            pcVar13 = "mindata";
            uVar8 = 0x1024;
            goto LAB_00187a99;
          }
          sVar5 = fwrite(&local_b0,8,1,pFVar3);
          if (sVar5 != 1) {
            pcVar13 = "maxdata";
            uVar8 = 0x1025;
            goto LAB_00187a99;
          }
        }
        uVar7 = local_68 + 1;
        pdVar14 = local_38 + 1;
      } while (uVar7 != local_40);
    }
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"plt tet min/max");
    }
    pFVar3 = local_80;
    uVar4 = ref_gather_node_tec_block
                      (ref_node,local_58,local_a0,(REF_INT)local_98,local_60,local_84,
                       (FILE *)local_80);
    pRVar2 = local_48;
    if (uVar4 == 0) {
      if (1 < ref_mpi->timing) {
        ref_mpi_stopwatch_stop(ref_mpi,"plt tet node");
      }
      uVar4 = ref_gather_cell_tec(ref_node,pRVar2,local_50,local_a0,1,(FILE *)pFVar3);
      if (uVar4 == 0) {
        if (1 < ref_mpi->timing) {
          ref_mpi_stopwatch_stop(ref_mpi,"plt tet cell");
        }
        goto LAB_00187a26;
      }
      pcVar13 = "c2n";
      uVar8 = 0x1032;
    }
    else {
      pcVar13 = "block points";
      uVar8 = 0x102d;
    }
  }
  else {
    pcVar13 = "l2c";
    uVar8 = 0xff0;
  }
LAB_00187360:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar8,
         "ref_gather_plt_tet_zone",(ulong)uVar4,pcVar13);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_tet_zone(REF_GRID ref_grid,
                                                  REF_INT ldim, REF_DBL *scalar,
                                                  FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  float zonemarker = 299.0;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int dataformat = 2; /*1=Float, 2=Double*/
  int passive = 0;
  int varsharing = 0;
  int connsharing = -1;
  double mindata, maxdata, tempdata;
  REF_INT node, ixyz, i;

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet start");

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet compact");

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    for (i = 0; i < 3 + ldim; i++) {
      REIS(1, fwrite(&dataformat, sizeof(int), 1, file), "int");
    }

    REIS(1, fwrite(&passive, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varsharing, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&connsharing, sizeof(int), 1, file), "int");
  }

  for (ixyz = 0; ixyz < 3; ixyz++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, ref_node_xyz(ref_node, ixyz, node));
        maxdata = MAX(maxdata, ref_node_xyz(ref_node, ixyz, node));
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  for (i = 0; i < ldim; i++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, scalar[i + ldim * node]);
        maxdata = MAX(maxdata, scalar[i + ldim * node]);
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet min/max");

  RSS(ref_gather_node_tec_block(ref_node, nnode, l2c, ldim, scalar, dataformat,
                                file),
      "block points");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet node");

  RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_TRUE, file),
      "c2n");
  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt tet cell");

  ref_free(l2c);
  return REF_SUCCESS;
}